

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O2

void sys_rename(Process *proc,Args *args)

{
  path dst;
  path src;
  path pStack_98;
  string local_78;
  string local_58;
  path local_38;
  
  ReadString_abi_cxx11_(&local_78,(pid_t)args->PID,args->Arg[0]);
  std::__cxx11::string::string((string *)&pStack_98,(string *)&local_78);
  Process::Normalise(&local_38,proc,&pStack_98);
  std::__cxx11::string::~string((string *)&pStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  ReadString_abi_cxx11_(&local_58,(pid_t)args->PID,args->Arg[1]);
  std::__cxx11::string::string((string *)&local_78,(string *)&local_58);
  Process::Normalise(&pStack_98,proc,(path *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (-1 < args->Return) {
    Process::Rename(proc,&local_38,&pStack_98);
  }
  std::__cxx11::string::~string((string *)&pStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void sys_rename(Process *proc, const Args &args)
{
  const fs::path src = proc->Normalise(ReadString(args.PID, args[0]));
  const fs::path dst = proc->Normalise(ReadString(args.PID, args[1]));

  if (args.Return >= 0) {
    proc->Rename(src, dst);
  }
}